

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O1

int Cudd_ShuffleHeap(DdManager *table,int *permutation)

{
  MtrNode *treenode;
  int iVar1;
  int *perm;
  long lVar2;
  int *invperm;
  long lVar3;
  
  if (0 < (long)table->size) {
    invperm = table->invperm;
    lVar3 = 0;
    do {
      if (permutation[lVar3] != invperm[lVar3]) {
        iVar1 = ddReorderPreprocess(table);
        if (iVar1 == 0) {
          return 0;
        }
        if (table->peakLiveNodes < table->keys) {
          table->peakLiveNodes = table->keys;
        }
        lVar3 = (long)table->size;
        perm = (int *)malloc(lVar3 * 4);
        if (0 < lVar3) {
          lVar2 = 0;
          do {
            invperm = (int *)(long)permutation[lVar2];
            perm[(long)invperm] = (int)lVar2;
            lVar2 = lVar2 + 1;
          } while (lVar3 != lVar2);
        }
        treenode = table->tree;
        iVar1 = ddCheckPermuation(table,treenode,perm,invperm);
        if ((iVar1 != 0) && (iVar1 = ddUpdateMtrTree(table,treenode,perm,invperm), iVar1 != 0)) {
          if (perm != (int *)0x0) {
            free(perm);
          }
          iVar1 = ddShuffle(table,permutation);
          if (table->interact == (long *)0x0) {
            return iVar1;
          }
          free(table->interact);
          table->interact = (long *)0x0;
          return iVar1;
        }
        if (perm == (int *)0x0) {
          return 0;
        }
        free(perm);
        return 0;
      }
      lVar3 = lVar3 + 1;
    } while (table->size != lVar3);
  }
  return 1;
}

Assistant:

int
Cudd_ShuffleHeap(
  DdManager * table /* DD manager */,
  int * permutation /* required variable permutation */)
{

    int result;
    int i;
    int identity = 1;
    int *perm;

    /* Don't waste time in case of identity permutation. */
    for (i = 0; i < table->size; i++) {
        if (permutation[i] != table->invperm[i]) {
            identity = 0;
            break;
        }
    }
    if (identity == 1) {
        return(1);
    }
    if (!ddReorderPreprocess(table)) return(0);
    if (table->keys > table->peakLiveNodes) {
        table->peakLiveNodes = table->keys;
    }

    perm = ABC_ALLOC(int, table->size);
    for (i = 0; i < table->size; i++)
        perm[permutation[i]] = i;
    if (!ddCheckPermuation(table,table->tree,perm,permutation)) {
        ABC_FREE(perm);
        return(0);
    }
    if (!ddUpdateMtrTree(table,table->tree,perm,permutation)) {
        ABC_FREE(perm);
        return(0);
    }
    ABC_FREE(perm);

    result = ddShuffle(table,permutation);

    if (!ddReorderPostprocess(table)) return(0);

    return(result);

}